

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O1

void Llb_ManMinCutTest(Aig_Man_t *pAig,int Num)

{
  void *__ptr;
  Aig_Man_t *p;
  Vec_Ptr_t *vResult;
  Gia_ParLlb_t *pPars;
  long lVar1;
  Gia_ParLlb_t Pars;
  Gia_ParLlb_t local_98;
  
  local_98.nPartValue = 0;
  local_98.fBackward = 0;
  local_98.fSkipOutCheck = 0;
  local_98._92_4_ = 0;
  local_98.fDumpReached = 0;
  local_98.nBddMax = 1000000;
  local_98.nIterMax = 10000000;
  local_98.nClusterMax = 0x14;
  local_98.nHintDepth = 0;
  local_98.HintFirst = 0;
  local_98.fUseFlow = 0;
  local_98.nVolumeMax = 100;
  local_98.nVolumeMin = 0x1e;
  local_98.fReorder = 1;
  local_98.fVerbose = 0;
  local_98.fVeryVerbose = 0;
  local_98.fSilent = 0;
  local_98.fSkipReach = 0;
  local_98.TimeLimit = 0;
  local_98.TimeLimitGlo = 0;
  local_98.TimeTarget = 0;
  local_98.fIndConstr = 0;
  local_98.fUsePivots = 0;
  local_98.fCluster = 0;
  local_98.fSchedule = 0;
  local_98.iFrame = -1;
  local_98._108_4_ = 0;
  p = Aig_ManDupFlopsOnly(pAig);
  Aig_ManPrintStats(pAig);
  Aig_ManPrintStats(p);
  Aig_ManFanoutStart(p);
  vResult = Llb_ManComputeCuts(p,Num,1,0);
  Llb_CoreExperiment(pAig,p,&local_98,vResult,0);
  if (0 < vResult->nSize) {
    lVar1 = 0;
    do {
      __ptr = vResult->pArray[lVar1];
      if (__ptr != (void *)0x0) {
        if (*(void **)((long)__ptr + 8) != (void *)0x0) {
          free(*(void **)((long)__ptr + 8));
          *(undefined8 *)((long)__ptr + 8) = 0;
        }
        free(__ptr);
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 < vResult->nSize);
  }
  if (vResult->pArray != (void **)0x0) {
    free(vResult->pArray);
    vResult->pArray = (void **)0x0;
  }
  if (vResult != (Vec_Ptr_t *)0x0) {
    free(vResult);
  }
  Aig_ManFanoutStop(p);
  Aig_ManCleanMarkAB(p);
  Aig_ManStop(p);
  return;
}

Assistant:

void Llb_ManMinCutTest( Aig_Man_t * pAig, int Num )
{
    extern void Llb_BddConstructTest( Aig_Man_t * p, Vec_Ptr_t * vResult );
    extern void Llb_BddExperiment( Aig_Man_t * pInit, Aig_Man_t * pAig, Gia_ParLlb_t * pPars, Vec_Ptr_t * vResult, Vec_Ptr_t * vMaps );
 

//    int fVerbose = 1;
    Gia_ParLlb_t Pars, * pPars = &Pars;
    Vec_Ptr_t * vResult;//, * vSupps, * vMaps;
    Aig_Man_t * p;

    Llb_BddSetDefaultParams( pPars );

    p = Aig_ManDupFlopsOnly( pAig );
//Aig_ManShow( p, 0, NULL );
    Aig_ManPrintStats( pAig );
    Aig_ManPrintStats( p );
    Aig_ManFanoutStart( p );

    vResult = Llb_ManComputeCuts( p, Num, 1, 0 );
//    vSupps  = Llb_ManCutSupps( p, vResult );
//    vMaps   = Llb_ManCutMap( p, vResult, vSupps );

//    Llb_BddExperiment( pAig, p, pPars, vResult, vMaps );
    Llb_CoreExperiment( pAig, p, pPars, vResult, 0 );

//    Vec_VecFree( (Vec_Vec_t *)vMaps );
//    Vec_VecFree( (Vec_Vec_t *)vSupps );
    Vec_VecFree( (Vec_Vec_t *)vResult );

    Aig_ManFanoutStop( p );
    Aig_ManCleanMarkAB( p );
    Aig_ManStop( p );
}